

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

int SetChunk(char *fourcc,int chunk_num,WebPChunkIterator *iter)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  int iVar6;
  uint8_t *mem_buf;
  long *plVar7;
  
  iVar4 = 0;
  if (((-1 < chunk_num) && (fourcc != (char *)0x0)) &&
     (pvVar1 = iter->private_, pvVar1 != (void *)0x0)) {
    lVar2 = *(long *)((long)pvVar1 + 0x20);
    plVar5 = *(long **)((long)pvVar1 + 0x58);
    iVar4 = 0;
    iVar6 = 0;
    if (plVar5 != (long *)0x0) {
      iVar6 = 0;
      plVar7 = plVar5;
      do {
        lVar3 = *plVar7;
        plVar7 = (long *)plVar7[2];
        iVar6 = iVar6 + (uint)(*(int *)(lVar2 + lVar3) == *(int *)fourcc);
      } while (plVar7 != (long *)0x0);
    }
    if (iVar6 != 0) {
      if (chunk_num == 0) {
        chunk_num = iVar6;
      }
      if (chunk_num <= iVar6) {
        if (plVar5 != (long *)0x0) {
          iVar4 = 0;
          do {
            iVar4 = (uint)(*(int *)(lVar2 + *plVar5) == *(int *)fourcc) + iVar4;
            if (iVar4 == chunk_num) break;
            plVar5 = (long *)plVar5[2];
          } while (plVar5 != (long *)0x0);
        }
        (iter->chunk).bytes = (uint8_t *)(*plVar5 + lVar2 + 8);
        (iter->chunk).size = plVar5[1] - 8;
        iter->num_chunks = iVar6;
        iter->chunk_num = chunk_num;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int SetChunk(const char fourcc[4], int chunk_num,
                    WebPChunkIterator* const iter) {
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  int count;

  if (dmux == NULL || fourcc == NULL || chunk_num < 0) return 0;
  count = ChunkCount(dmux, fourcc);
  if (count == 0) return 0;
  if (chunk_num == 0) chunk_num = count;

  if (chunk_num <= count) {
    const uint8_t* const mem_buf = dmux->mem.buf;
    const Chunk* const chunk = GetChunk(dmux, fourcc, chunk_num);
    iter->chunk.bytes = mem_buf + chunk->data.offset + CHUNK_HEADER_SIZE;
    iter->chunk.size  = chunk->data.size - CHUNK_HEADER_SIZE;
    iter->num_chunks  = count;
    iter->chunk_num   = chunk_num;
    return 1;
  }
  return 0;
}